

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::StochasticTask::checkArguments
          (StochasticTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5
          )

{
  bool bVar1;
  Compilation *this_00;
  Type *this_01;
  Type *pTVar2;
  undefined8 in_RCX;
  undefined1 isMethod;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *in_RDI;
  ASTContext *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_00000020;
  size_t i;
  size_t totalArgs;
  Compilation *comp;
  Type *local_60;
  Args *args_00;
  SystemSubroutine *in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RCX >> 0x38);
  args_00 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0xb3e5f9);
  this_01 = (Type *)(in_RDI[3]._M_extent._M_extent_value + (long)in_RDI[4]._M_ptr);
  pTVar2 = this_01;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_fffffffffffffff8,in_R8,(bool)isMethod,args_00,in_stack_00000000,
                     in_stack_00000020,i);
  if (bVar1) {
    for (local_60 = (Type *)0x0; local_60 < pTVar2;
        local_60 = (Type *)((long)&(local_60->super_Symbol).kind + 1)) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                (in_RDX,(size_type)local_60);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb3e69d)
      ;
      bVar1 = Type::isIntegral(this_01);
      if (!bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                  (in_RDX,(size_type)local_60);
        pTVar2 = SystemSubroutine::badArg
                           ((SystemSubroutine *)this_00,(ASTContext *)pTVar2,(Expression *)in_R8);
        return pTVar2;
      }
    }
    if ((int)in_RDI[2]._M_extent._M_extent_value == 0) {
      pTVar2 = Compilation::getIntType(this_00);
    }
    else {
      pTVar2 = Compilation::getVoidType(this_00);
    }
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        size_t totalArgs = inputArgs + outputArgs;
        if (!checkArgCount(context, false, args, range, totalArgs, totalArgs))
            return comp.getErrorType();

        for (size_t i = 0; i < totalArgs; i++) {
            if (!args[i]->type->isIntegral())
                return badArg(context, *args[i]);
        }

        return kind == SubroutineKind::Function ? comp.getIntType() : comp.getVoidType();
    }